

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O3

Fl_Tree_Item * __thiscall Fl_Tree_Item::next_visible(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs)

{
  char cVar1;
  char cVar2;
  Fl_Tree_Item *pFVar3;
  Fl_Tree_Item *this_00;
  
  this_00 = next(this);
  if (this_00 != (Fl_Tree_Item *)0x0) {
    cVar1 = prefs->_showroot;
    do {
      if ((this_00->_parent != (Fl_Tree_Item *)0x0) || (cVar1 != '\0')) {
        cVar2 = this_00->_visible;
        pFVar3 = this_00;
        while (cVar2 != '\0') {
          pFVar3 = pFVar3->_parent;
          if (pFVar3 == (Fl_Tree_Item *)0x0) {
            return this_00;
          }
          if (pFVar3->_visible == '\0') break;
          cVar2 = pFVar3->_open;
        }
      }
      this_00 = next(this_00);
    } while (this_00 != (Fl_Tree_Item *)0x0);
  }
  return (Fl_Tree_Item *)0x0;
}

Assistant:

Fl_Tree_Item *Fl_Tree_Item::next_visible(Fl_Tree_Prefs &prefs) {
  Fl_Tree_Item *item = this;
  while ( 1 ) {
    item = item->next();
    if ( !item ) return 0;
    if ( item->is_root() && !prefs.showroot() ) continue;
    if ( item->visible_r() ) return(item);
  }
}